

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Relational(DataParser *parser)

{
  ulong uVar1;
  byte bVar2;
  pointer pcVar3;
  ulong uVar4;
  Instruction IVar5;
  ulong uVar6;
  Variant VStack_48;
  
  Additive(parser);
  if (parser->reached_end != false) {
    return;
  }
  do {
    bVar2 = (parser->expression)._M_dataplus._M_p[parser->index];
    if (bVar2 < 0x3d) {
      if (bVar2 == 0x21) {
        DataParser::Match(parser,'!',false);
        DataParser::Match(parser,'=',true);
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,NotEqual,&VStack_48);
      }
      else {
        if (bVar2 != 0x3c) {
          return;
        }
        DataParser::Match(parser,'<',false);
        bVar2 = parser->reached_end;
        if ((bool)bVar2 == true) {
          pcVar3 = (parser->expression)._M_dataplus._M_p;
          uVar4 = parser->index;
          uVar6 = 0;
LAB_001f2524:
          uVar1 = (parser->expression)._M_string_length;
          while ((uVar4 = uVar4 + 1, (byte)uVar6 < 0x21 &&
                 ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
            parser->index = uVar4;
            if (uVar4 < uVar1) {
              if ((bVar2 & 1) != 0) goto LAB_001f2548;
              uVar6 = (ulong)(byte)pcVar3[uVar4];
            }
            else {
              parser->reached_end = true;
              bVar2 = 1;
LAB_001f2548:
              uVar6 = 0;
            }
          }
          IVar5 = Less;
        }
        else {
          pcVar3 = (parser->expression)._M_dataplus._M_p;
          uVar4 = parser->index;
          uVar6 = (ulong)(byte)pcVar3[uVar4];
          if (pcVar3[uVar4] != 0x3d) goto LAB_001f2524;
          DataParser::Match(parser,'=',true);
          IVar5 = LessEq;
        }
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,IVar5,&VStack_48);
      }
    }
    else {
      if (bVar2 != 0x3e) {
        if (bVar2 != 0x3d) {
          return;
        }
        DataParser::Match(parser,'=',false);
        DataParser::Match(parser,'=',true);
        DataParser::Push(parser);
        Additive(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_48);
        DataParser::Emit(parser,Equal,&VStack_48);
        goto LAB_001f2592;
      }
      DataParser::Match(parser,'>',false);
      bVar2 = parser->reached_end;
      if ((bool)bVar2 == true) {
        pcVar3 = (parser->expression)._M_dataplus._M_p;
        uVar4 = parser->index;
        uVar6 = 0;
LAB_001f2487:
        uVar1 = (parser->expression)._M_string_length;
        while ((uVar4 = uVar4 + 1, (byte)uVar6 < 0x21 && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)
               )) {
          parser->index = uVar4;
          if (uVar4 < uVar1) {
            if ((bVar2 & 1) != 0) goto LAB_001f24ab;
            uVar6 = (ulong)(byte)pcVar3[uVar4];
          }
          else {
            parser->reached_end = true;
            bVar2 = 1;
LAB_001f24ab:
            uVar6 = 0;
          }
        }
        IVar5 = Greater;
      }
      else {
        pcVar3 = (parser->expression)._M_dataplus._M_p;
        uVar4 = parser->index;
        uVar6 = (ulong)(byte)pcVar3[uVar4];
        if (pcVar3[uVar4] != 0x3d) goto LAB_001f2487;
        DataParser::Match(parser,'=',true);
        IVar5 = GreaterEq;
      }
      DataParser::Push(parser);
      Additive(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&VStack_48);
      DataParser::Emit(parser,IVar5,&VStack_48);
    }
LAB_001f2592:
    Variant::~Variant(&VStack_48);
    if (parser->reached_end == true) {
      return;
    }
  } while( true );
}

Assistant:

static void Relational(DataParser& parser)
	{
		Additive(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '=': Equal(parser); break;
			case '!': NotEqual(parser); break;
			case '<': Less(parser); break;
			case '>': Greater(parser); break;
			default: looping = false;
			}
		}
	}